

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorToolset
          (cmGlobalGhsMultiGenerator *this,string *ts,bool build,cmMakefile *mf)

{
  bool bVar1;
  cmValue c2;
  undefined7 in_register_00000011;
  char *__rhs;
  string_view value;
  cmAlphaNum local_e0;
  cmValue prevTool;
  string tsp;
  string gbuild;
  string local_68;
  cmAlphaNum local_48;
  
  if ((int)CONCAT71(in_register_00000011,build) == 0) {
    tsp._M_dataplus._M_p = (pointer)&tsp.field_2;
    tsp._M_string_length = 0;
    tsp.field_2._M_local_buf[0] = '\0';
    GetToolset(this,mf,&tsp,ts);
    if (tsp._M_string_length == 0) {
      bVar1 = false;
    }
    else {
      __rhs = "/";
      if (tsp._M_dataplus._M_p[tsp._M_string_length - 1] == '/') {
        __rhs = "";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                     &tsp,__rhs);
      std::operator+(&gbuild,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_e0,DEFAULT_BUILD_PROGRAM);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&local_48);
      c2 = cmMakefile::GetDefinition(mf,(string *)&local_e0);
      prevTool.Value = c2.Value;
      std::__cxx11::string::~string((string *)&local_e0);
      if (((c2.Value == (string *)0x0) || ((c2.Value)->_M_string_length == 0)) ||
         (bVar1 = cmsys::SystemTools::ComparePath(&gbuild,c2.Value), bVar1)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&local_48);
        cmMakefile::AddCacheDefinition
                  (mf,(string *)&local_e0,gbuild._M_dataplus._M_p,"build program to use",INTERNAL,
                   true);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"CMAKE_SYSTEM_VERSION",(allocator<char> *)&local_48);
        value._M_str = tsp._M_dataplus._M_p;
        value._M_len = tsp._M_string_length;
        cmMakefile::AddDefinition(mf,(string *)&local_e0,value);
        std::__cxx11::string::~string((string *)&local_e0);
        bVar1 = true;
      }
      else {
        local_e0.View_._M_len = 0x14;
        local_e0.View_._M_str = "toolset build tool: ";
        local_48.View_._M_len = gbuild._M_string_length;
        local_48.View_._M_str = gbuild._M_dataplus._M_p;
        cmStrCat<char[49],cmValue,char[104]>
                  (&local_68,&local_e0,&local_48,
                   (char (*) [49])"\nDoes not match the previously used build tool: ",&prevTool,
                   (char (*) [104])
                   "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&gbuild);
    }
    std::__cxx11::string::~string((string *)&tsp);
    return bVar1;
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorToolset(std::string const& ts,
                                                    bool build, cmMakefile* mf)
{
  /* In build mode nothing to be done.
   * Toolset already determined and build tool absolute path is cached.
   */
  if (build) {
    return true;
  }

  /* Determine the absolute directory for the toolset */
  std::string tsp;
  this->GetToolset(mf, tsp, ts);

  /* no toolset was found */
  if (tsp.empty()) {
    return false;
  }

  /* set the build tool to use */
  std::string gbuild(tsp + ((tsp.back() == '/') ? "" : "/") +
                     DEFAULT_BUILD_PROGRAM);
  cmValue prevTool = mf->GetDefinition("CMAKE_MAKE_PROGRAM");

  /* check if the toolset changed from last generate */
  if (cmNonempty(prevTool) && !cmSystemTools::ComparePath(gbuild, prevTool)) {
    std::string const& e =
      cmStrCat("toolset build tool: ", gbuild,
               "\nDoes not match the previously used build tool: ", prevTool,
               "\nEither remove the CMakeCache.txt file and CMakeFiles "
               "directory or choose a different binary directory.");
    mf->IssueMessage(MessageType::FATAL_ERROR, e);
    return false;
  }

  /* store the toolset that is being used for this build */
  mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", gbuild, "build program to use",
                         cmStateEnums::INTERNAL, true);

  mf->AddDefinition("CMAKE_SYSTEM_VERSION", tsp);

  return true;
}